

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall
Js::CompoundString::CompoundString(CompoundString *this,CompoundString *other,bool forAppending)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t newLength;
  StaticType *type;
  undefined4 *puVar4;
  
  type = StringCache::GetStringTypeStatic
                   (&((((other->super_LiteralString).super_JavascriptString.super_RecyclableObject.
                        type.ptr)->javascriptLibrary).ptr)->stringCache);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0138ed08;
  BlockInfo::BlockInfo(&this->lastBlockInfo,&other->lastBlockInfo);
  this->directCharLength = other->directCharLength;
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierPtr
            (&this->lastBlock,&other->lastBlock);
  bVar3 = JavascriptString::IsFinalized((JavascriptString *)other);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1fa,"(!other.IsFinalized())","!other.IsFinalized()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  newLength = JavascriptString::GetLength((JavascriptString *)other);
  JavascriptString::SetLength((JavascriptString *)this,newLength);
  if (forAppending) {
    TVar1 = other->ownsLastBlock;
    other->ownsLastBlock = false;
    this->ownsLastBlock = TVar1;
    if (TVar1 == false) {
      TakeOwnershipOfLastBlock(this);
      return;
    }
  }
  else {
    this->ownsLastBlock = false;
  }
  return;
}

Assistant:

CompoundString::CompoundString(CompoundString &other, const bool forAppending)
        : LiteralString(other.GetLibrary()->GetStringTypeStatic()),
        lastBlockInfo(other.lastBlockInfo),
        directCharLength(other.directCharLength),
        lastBlock(other.lastBlock)
    {
        Assert(!other.IsFinalized());

        SetLength(other.GetLength());

        if(forAppending)
        {
            // This compound string will be used for appending, so take ownership of the last block. Appends are fast for a
            // compound string that owns the last block.
            const bool ownsLastBlock = other.ownsLastBlock;
            other.ownsLastBlock = false;
            this->ownsLastBlock = ownsLastBlock;
            if(ownsLastBlock)
                return;
            TakeOwnershipOfLastBlock();
            return;
        }

        ownsLastBlock = false;
    }